

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Synchronize(PortMidiStream *stream)

{
  PmError local_1c;
  PmError err;
  PmInternal *midi;
  PortMidiStream *stream_local;
  
  local_1c = pmNoData;
  if (stream == (PortMidiStream *)0x0) {
    local_1c = pmBadPtr;
  }
  else if (descriptors[*stream].pub.output == 0) {
    local_1c = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_1c = pmBadPtr;
  }
  else {
    *(undefined4 *)((long)stream + 0x4c) = 1;
  }
  return local_1c;
}

Assistant:

PmError Pm_Synchronize( PortMidiStream* stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        midi->first_message = TRUE;
    return err;
}